

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O0

MtrNode * Mtr_MakeGroup(MtrNode *root,uint low,uint size,uint flags)

{
  bool bVar1;
  MtrNode *newn;
  MtrNode *previous;
  MtrNode *last;
  MtrNode *first;
  MtrNode *node;
  uint flags_local;
  uint size_local;
  uint low_local;
  MtrNode *root_local;
  
  if (size == 0) {
    root_local = (MtrNode *)0x0;
  }
  else if ((low < root->low) || (root->low + root->size < low + size)) {
    root_local = (MtrNode *)0x0;
  }
  else if ((root->size == size) && (root->low == low)) {
    root->flags = flags;
    root_local = root;
  }
  else if (root->child == (MtrNode *)0x0) {
    root_local = Mtr_AllocNode();
    if (root_local == (MtrNode *)0x0) {
      root_local = (MtrNode *)0x0;
    }
    else {
      root_local->low = low;
      root_local->size = size;
      root_local->flags = flags;
      root_local->parent = root;
      root_local->child = (MtrNode *)0x0;
      root_local->younger = (MtrNode *)0x0;
      root_local->elder = (MtrNode *)0x0;
      root->child = root_local;
    }
  }
  else {
    newn = (MtrNode *)0x0;
    last = root->child;
    while( true ) {
      bVar1 = false;
      if (last != (MtrNode *)0x0) {
        bVar1 = last->low + last->size <= low;
      }
      if (!bVar1) break;
      newn = last;
      last = last->younger;
    }
    if (last == (MtrNode *)0x0) {
      root_local = Mtr_AllocNode();
      if (root_local == (MtrNode *)0x0) {
        root_local = (MtrNode *)0x0;
      }
      else {
        root_local->low = low;
        root_local->size = size;
        root_local->flags = flags;
        root_local->parent = root;
        root_local->elder = newn;
        newn->younger = root_local;
        root_local->child = (MtrNode *)0x0;
        root_local->younger = (MtrNode *)0x0;
      }
    }
    else if ((low < last->low) || (last->low + last->size < low + size)) {
      if (last->low < low + size) {
        if ((low < last->low) && (low + size < last->low + last->size)) {
          root_local = (MtrNode *)0x0;
        }
        else if (last->low < low) {
          root_local = (MtrNode *)0x0;
        }
        else {
          previous = last->younger;
          while( true ) {
            bVar1 = false;
            if (previous != (MtrNode *)0x0) {
              bVar1 = previous->low + previous->size < low + size;
            }
            if (!bVar1) break;
            previous = previous->younger;
          }
          if (previous == (MtrNode *)0x0) {
            root_local = Mtr_AllocNode();
            if (root_local == (MtrNode *)0x0) {
              root_local = (MtrNode *)0x0;
            }
            else {
              root_local->low = low;
              root_local->size = size;
              root_local->flags = flags;
              root_local->child = last;
              root_local->parent = root;
              root_local->elder = newn;
              root_local->younger = (MtrNode *)0x0;
              last->elder = (MtrNode *)0x0;
              if (newn == (MtrNode *)0x0) {
                root->child = root_local;
              }
              else {
                newn->younger = root_local;
              }
              for (previous = last; previous != (MtrNode *)0x0; previous = previous->younger) {
                previous->parent = root_local;
              }
            }
          }
          else if (((low + size) - 1 < previous->low) ||
                  (previous->low + previous->size <= low + size)) {
            root_local = Mtr_AllocNode();
            if (root_local == (MtrNode *)0x0) {
              root_local = (MtrNode *)0x0;
            }
            else {
              root_local->low = low;
              root_local->size = size;
              root_local->flags = flags;
              root_local->child = last;
              root_local->parent = root;
              if (newn == (MtrNode *)0x0) {
                root->child = root_local;
              }
              else {
                newn->younger = root_local;
              }
              root_local->elder = newn;
              root_local->younger = previous->younger;
              if (previous->younger != (MtrNode *)0x0) {
                previous->younger->elder = root_local;
              }
              previous->younger = (MtrNode *)0x0;
              last->elder = (MtrNode *)0x0;
              for (first = last; first != (MtrNode *)0x0; first = first->younger) {
                first->parent = root_local;
              }
            }
          }
          else {
            root_local = (MtrNode *)0x0;
          }
        }
      }
      else {
        root_local = Mtr_AllocNode();
        if (root_local == (MtrNode *)0x0) {
          root_local = (MtrNode *)0x0;
        }
        else {
          root_local->low = low;
          root_local->size = size;
          root_local->flags = flags;
          root_local->child = (MtrNode *)0x0;
          root_local->parent = root;
          root_local->elder = newn;
          root_local->younger = last;
          last->elder = root_local;
          if (newn == (MtrNode *)0x0) {
            root->child = root_local;
          }
          else {
            newn->younger = root_local;
          }
        }
      }
    }
    else {
      root_local = Mtr_MakeGroup(last,low,size,flags);
    }
  }
  return root_local;
}

Assistant:

MtrNode *
Mtr_MakeGroup(
  MtrNode * root /* root of the group tree */,
  unsigned int  low /* lower bound of the group */,
  unsigned int  size /* upper bound of the group */,
  unsigned int  flags /* flags for the new group */)
{
    MtrNode *node,
            *first,
            *last,
            *previous,
            *newn;

    /* Sanity check. */
    if (size == 0)
        return(NULL);

    /* Check whether current group includes new group.  This check is
    ** necessary at the top-level call.  In the subsequent calls it is
    ** redundant. */
    if (low < (unsigned int) root->low ||
        low + size > (unsigned int) (root->low + root->size))
        return(NULL);

    /* Trying to create an existing group has the effect of updating
    ** the flags. */
    if (root->size == size && root->low == low) {
        root->flags = flags;
        return(root);
    }

    /* At this point we know that the new group is properly contained
    ** in the group of root. We have two possible cases here: - root
    ** is a terminal node; - root has children. */

    /* Root has no children: create a new group. */
    if (root->child == NULL) {
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->parent = root;
        newn->elder = newn->younger = newn->child = NULL;
        root->child = newn;
        return(newn);
    }

    /* Root has children: Find all chidren of root that are included
    ** in the new group. If the group of any child entirely contains
    ** the new group, call Mtr_MakeGroup recursively. */
    previous = NULL;
    first = root->child; /* guaranteed to be non-NULL */
    while (first != NULL && low >= (unsigned int) (first->low + first->size)) {
        previous = first;
        first = first->younger;
    }
    if (first == NULL) {
        /* We have scanned the entire list and we need to append a new
        ** child at the end of it.  Previous points to the last child
        ** of root. */
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->parent = root;
        newn->elder = previous;
        previous->younger = newn;
        newn->younger = newn->child = NULL;
        return(newn);
    }
    /* Here first is non-NULL and low < first->low + first->size. */
    if (low >= (unsigned int) first->low &&
        low + size <= (unsigned int) (first->low + first->size)) {
        /* The new group is contained in the group of first. */
        newn = Mtr_MakeGroup(first, low, size, flags);
        return(newn);
    } else if (low + size <= first->low) {
        /* The new group is entirely contained in the gap between
        ** previous and first. */
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->child = NULL;
        newn->parent = root;
        newn->elder = previous;
        newn->younger = first;
        first->elder = newn;
        if (previous != NULL) {
            previous->younger = newn;
        } else {
            root->child = newn;
        }
        return(newn);
    } else if (low < (unsigned int) first->low &&
               low + size < (unsigned int) (first->low + first->size)) {
        /* Trying to cut an existing group: not allowed. */
        return(NULL);
    } else if (low > first->low) {
        /* The new group neither is contained in the group of first
        ** (this was tested above) nor contains it. It is therefore
        ** trying to cut an existing group: not allowed. */
        return(NULL);
    }

    /* First holds the pointer to the first child contained in the new
    ** group. Here low <= first->low and low + size >= first->low +
    ** first->size.  One of the two inequalities is strict. */
    last = first->younger;
    while (last != NULL &&
           (unsigned int) (last->low + last->size) < low + size) {
        last = last->younger;
    }
    if (last == NULL) {
        /* All the chilren of root from first onward become children
        ** of the new group. */
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->child = first;
        newn->parent = root;
        newn->elder = previous;
        newn->younger = NULL;
        first->elder = NULL;
        if (previous != NULL) {
            previous->younger = newn;
        } else {
            root->child = newn;
        }
        last = first;
        while (last != NULL) {
            last->parent = newn;
            last = last->younger;
        }
        return(newn);
    }

    /* Here last != NULL and low + size <= last->low + last->size. */
    if (low + size - 1 >= (unsigned int) last->low &&
        low + size < (unsigned int) (last->low + last->size)) {
        /* Trying to cut an existing group: not allowed. */
        return(NULL);
    }

    /* First and last point to the first and last of the children of
    ** root that are included in the new group. Allocate a new node
    ** and make all children of root between first and last chidren of
    ** the new node.  Previous points to the child of root immediately
    ** preceeding first. If it is NULL, then first is the first child
    ** of root. */
    newn = Mtr_AllocNode();
    if (newn == NULL) return(NULL);     /* out of memory */
    newn->low = low;
    newn->size = size;
    newn->flags = flags;
    newn->child = first;
    newn->parent = root;
    if (previous == NULL) {
        root->child = newn;
    } else {
        previous->younger = newn;
    }
    newn->elder = previous;
    newn->younger = last->younger;
    if (last->younger != NULL) {
        last->younger->elder = newn;
    }
    last->younger = NULL;
    first->elder = NULL;
    for (node = first; node != NULL; node = node->younger) {
        node->parent = newn;
    }

    return(newn);

}